

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LowerMDShared.cpp
# Opt level: O3

Instr * __thiscall LowererMD::LowerLeaveNull(LowererMD *this,Instr *finallyEndInstr)

{
  Instr *pIVar1;
  Func *pFVar2;
  code *pcVar3;
  RegNum RVar4;
  bool bVar5;
  StackSym *sym;
  RegOpnd *dstOpnd;
  Instr *pIVar6;
  RegOpnd *pRVar7;
  undefined4 *puVar8;
  RegOpnd *pRVar9;
  HelperCallOpnd *src1Opnd;
  IntConstOpnd *this_00;
  byte bVar10;
  
  pIVar1 = finallyEndInstr->m_prev;
  sym = StackSym::New(TyInt64,this->m_func);
  RVar4 = LowererMDArch::GetRegReturn(TyInt64);
  dstOpnd = IR::RegOpnd::New(sym,RVar4,TyInt64,this->m_func);
  pIVar6 = IR::Instr::New(XOR,&dstOpnd->super_Opnd,this->m_func);
  RVar4 = LowererMDArch::GetRegReturn(TyInt64);
  pRVar7 = IR::RegOpnd::New((StackSym *)0x0,RVar4,TyInt64,this->m_func);
  if (pIVar6->m_src1 != (Opnd *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar8 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                       ,0x16c,"(this->m_src1 == __null)","Trying to overwrite existing src.");
    if (!bVar5) goto LAB_0064ff34;
    *puVar8 = 0;
  }
  pFVar2 = pIVar6->m_func;
  if ((pRVar7->super_Opnd).isDeleted == true) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar8 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                       ,0x14,"(!isDeleted)","Using deleted operand");
    if (!bVar5) goto LAB_0064ff34;
    *puVar8 = 0;
  }
  bVar10 = (pRVar7->super_Opnd).field_0xb;
  pRVar9 = pRVar7;
  if ((bVar10 & 2) != 0) {
    pRVar9 = (RegOpnd *)IR::Opnd::Copy(&pRVar7->super_Opnd,pFVar2);
    bVar10 = (pRVar9->super_Opnd).field_0xb;
  }
  (pRVar9->super_Opnd).field_0xb = bVar10 | 2;
  pIVar6->m_src1 = &pRVar9->super_Opnd;
  if (pIVar6->m_src2 != (Opnd *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar8 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                       ,0x18b,"(this->m_src2 == __null)","Trying to overwrite existing src.");
    if (!bVar5) goto LAB_0064ff34;
    *puVar8 = 0;
  }
  pFVar2 = pIVar6->m_func;
  if ((pRVar7->super_Opnd).isDeleted == true) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar8 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                       ,0x14,"(!isDeleted)","Using deleted operand");
    if (!bVar5) goto LAB_0064ff34;
    *puVar8 = 0;
  }
  bVar10 = (pRVar7->super_Opnd).field_0xb;
  if ((bVar10 & 2) != 0) {
    pRVar7 = (RegOpnd *)IR::Opnd::Copy(&pRVar7->super_Opnd,pFVar2);
    bVar10 = (pRVar7->super_Opnd).field_0xb;
  }
  (pRVar7->super_Opnd).field_0xb = bVar10 | 2;
  pIVar6->m_src2 = &pRVar7->super_Opnd;
  IR::Instr::InsertBefore(finallyEndInstr,pIVar6);
  pRVar7 = IR::RegOpnd::New((StackSym *)0x0,RegArg2,TyInt64,this->m_func);
  pIVar6 = IR::Instr::New(LdSpillSize,&pRVar7->super_Opnd,this->m_func);
  IR::Instr::InsertBefore(finallyEndInstr,pIVar6);
  pRVar7 = IR::RegOpnd::New((StackSym *)0x0,RegArg3,TyInt64,this->m_func);
  pIVar6 = IR::Instr::New(LdArgSize,&pRVar7->super_Opnd,this->m_func);
  IR::Instr::InsertBefore(finallyEndInstr,pIVar6);
  pRVar7 = IR::RegOpnd::New((StackSym *)0x0,RegArg0,TyInt64,this->m_func);
  src1Opnd = IR::HelperCallOpnd::New(HelperOp_ReturnFromCallWithFakeFrame,this->m_func);
  pIVar6 = IR::Instr::New(MOV,&pRVar7->super_Opnd,&src1Opnd->super_Opnd,this->m_func);
  IR::Instr::InsertBefore(finallyEndInstr,pIVar6);
  pIVar6 = IR::Instr::New(PUSH,this->m_func);
  if (pIVar6->m_src1 != (Opnd *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar8 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                       ,0x16c,"(this->m_src1 == __null)","Trying to overwrite existing src.");
    if (!bVar5) goto LAB_0064ff34;
    *puVar8 = 0;
  }
  pFVar2 = pIVar6->m_func;
  if ((pRVar7->super_Opnd).isDeleted == true) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar8 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                       ,0x14,"(!isDeleted)","Using deleted operand");
    if (!bVar5) goto LAB_0064ff34;
    *puVar8 = 0;
  }
  bVar10 = (pRVar7->super_Opnd).field_0xb;
  if ((bVar10 & 2) != 0) {
    pRVar7 = (RegOpnd *)IR::Opnd::Copy(&pRVar7->super_Opnd,pFVar2);
    bVar10 = (pRVar7->super_Opnd).field_0xb;
  }
  (pRVar7->super_Opnd).field_0xb = bVar10 | 2;
  pIVar6->m_src1 = &pRVar7->super_Opnd;
  IR::Instr::InsertBefore(finallyEndInstr,pIVar6);
  this_00 = IR::IntConstOpnd::New(0,TyInt32,this->m_func,false);
  pIVar6 = IR::Instr::New(RET,this->m_func);
  if (pIVar6->m_src1 != (Opnd *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar8 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                       ,0x16c,"(this->m_src1 == __null)","Trying to overwrite existing src.");
    if (!bVar5) goto LAB_0064ff34;
    *puVar8 = 0;
  }
  pFVar2 = pIVar6->m_func;
  if ((this_00->super_Opnd).isDeleted == true) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar8 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                       ,0x14,"(!isDeleted)","Using deleted operand");
    if (!bVar5) goto LAB_0064ff34;
    *puVar8 = 0;
  }
  bVar10 = (this_00->super_Opnd).field_0xb;
  if ((bVar10 & 2) != 0) {
    this_00 = (IntConstOpnd *)IR::Opnd::Copy(&this_00->super_Opnd,pFVar2);
    bVar10 = (this_00->super_Opnd).field_0xb;
  }
  (this_00->super_Opnd).field_0xb = bVar10 | 2;
  pIVar6->m_src1 = &this_00->super_Opnd;
  if (pIVar6->m_src2 != (Opnd *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar8 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                       ,0x18b,"(this->m_src2 == __null)","Trying to overwrite existing src.");
    if (!bVar5) goto LAB_0064ff34;
    *puVar8 = 0;
  }
  pFVar2 = pIVar6->m_func;
  if ((dstOpnd->super_Opnd).isDeleted == true) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar8 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                       ,0x14,"(!isDeleted)","Using deleted operand");
    if (!bVar5) {
LAB_0064ff34:
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar8 = 0;
  }
  bVar10 = (dstOpnd->super_Opnd).field_0xb;
  if ((bVar10 & 2) != 0) {
    dstOpnd = (RegOpnd *)IR::Opnd::Copy(&dstOpnd->super_Opnd,pFVar2);
    bVar10 = (dstOpnd->super_Opnd).field_0xb;
  }
  (dstOpnd->super_Opnd).field_0xb = bVar10 | 2;
  pIVar6->m_src2 = &dstOpnd->super_Opnd;
  IR::Instr::InsertBefore(finallyEndInstr,pIVar6);
  IR::Instr::Remove(finallyEndInstr);
  return pIVar1;
}

Assistant:

IR::Instr *
LowererMD::LowerLeaveNull(IR::Instr *finallyEndInstr)
{
    IR::Instr *instrPrev = finallyEndInstr->m_prev;
    IR::Instr *instr     = nullptr;

    // Return a null continuation address to the helper: execution will resume at the point determined by the try
    // or the exception handler.
    IR::RegOpnd *retReg = IR::RegOpnd::New(StackSym::New(TyMachReg,this->m_func), lowererMDArch.GetRegReturn(TyMachReg), TyMachReg, this->m_func);
    instr = IR::Instr::New(Js::OpCode::XOR, retReg, this->m_func);
    IR::RegOpnd *eaxOpnd = IR::RegOpnd::New(nullptr, lowererMDArch.GetRegReturn(TyMachReg), TyMachReg, this->m_func);
    instr->SetSrc1(eaxOpnd);
    instr->SetSrc2(eaxOpnd);
    finallyEndInstr->InsertBefore(instr);

#if _M_X64
    {
        // amd64_ReturnFromCallWithFakeFrame expects to find the spill size and args size
        // in REG_EH_SPILL_SIZE and REG_EH_ARGS_SIZE.

        // MOV REG_EH_SPILL_SIZE, spillSize
        IR::Instr *movR8 = IR::Instr::New(Js::OpCode::LdSpillSize,
                                          IR::RegOpnd::New(nullptr, REG_EH_SPILL_SIZE, TyMachReg, m_func),
                                          m_func);
        finallyEndInstr->InsertBefore(movR8);

        // MOV REG_EH_ARGS_SIZE, argsSize
        IR::Instr *movR9 = IR::Instr::New(Js::OpCode::LdArgSize,
                                          IR::RegOpnd::New(nullptr, REG_EH_ARGS_SIZE, TyMachReg, m_func),
                                          m_func);
        finallyEndInstr->InsertBefore(movR9);

        IR::Opnd *targetOpnd = IR::RegOpnd::New(nullptr, REG_EH_TARGET, TyMachReg, m_func);
        IR::Instr *movTarget = IR::Instr::New(Js::OpCode::MOV,
            targetOpnd,
            IR::HelperCallOpnd::New(IR::HelperOp_ReturnFromCallWithFakeFrame, m_func),
            m_func);
        finallyEndInstr->InsertBefore(movTarget);

        IR::Instr *push = IR::Instr::New(Js::OpCode::PUSH, m_func);
        push->SetSrc1(targetOpnd);
        finallyEndInstr->InsertBefore(push);
    }
#endif

    IR::IntConstOpnd *intSrc = IR::IntConstOpnd::New(0, TyInt32, this->m_func);
    instr = IR::Instr::New(Js::OpCode::RET, this->m_func);
    instr->SetSrc1(intSrc);
    instr->SetSrc2(retReg);
    finallyEndInstr->InsertBefore(instr);
    finallyEndInstr->Remove();

    return instrPrev;
}